

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O0

plain_range_sorted<CCountryFlags::CCountryFlag>
partition_binary<plain_range_sorted<CCountryFlags::CCountryFlag>,CCountryFlags::CCountryFlag>
          (plain_range_sorted<CCountryFlags::CCountryFlag> range,CCountryFlag value)

{
  plain_range<CCountryFlags::CCountryFlag> pVar1;
  bool bVar2;
  uint uVar3;
  int __c;
  CCountryFlag *in_RSI;
  CCountryFlag *in_RDI;
  long in_FS_OFFSET;
  plain_range_sorted<CCountryFlags::CCountryFlag> pVar4;
  uint pivot;
  CCountryFlag *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  plain_range_sorted<CCountryFlags::CCountryFlag> *in_stack_ffffffffffffff98;
  CCountryFlag *local_48;
  CCountryFlag *local_40;
  CCountryFlag *local_38;
  CCountryFlag *local_30;
  plain_range<CCountryFlags::CCountryFlag> local_28;
  CCountryFlag *local_18;
  CCountryFlag *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.begin = in_RDI;
  local_28.end = in_RSI;
  concept_empty::check<plain_range_sorted<CCountryFlags::CCountryFlag>>
            ((plain_range_sorted<CCountryFlags::CCountryFlag> *)&local_28);
  concept_index::check<plain_range_sorted<CCountryFlags::CCountryFlag>>
            ((plain_range_sorted<CCountryFlags::CCountryFlag> *)&local_28);
  concept_size::check<plain_range_sorted<CCountryFlags::CCountryFlag>>
            ((plain_range_sorted<CCountryFlags::CCountryFlag> *)&local_28);
  concept_slice::check<plain_range_sorted<CCountryFlags::CCountryFlag>>
            ((plain_range_sorted<CCountryFlags::CCountryFlag> *)&local_28);
  concept_sorted::check<plain_range_sorted<CCountryFlags::CCountryFlag>>
            ((plain_range_sorted<CCountryFlags::CCountryFlag> *)&local_28);
  bVar2 = plain_range<CCountryFlags::CCountryFlag>::empty(&local_28);
  if (bVar2) {
    local_18 = local_28.begin;
    local_10 = local_28.end;
  }
  else {
    plain_range<CCountryFlags::CCountryFlag>::back
              ((plain_range<CCountryFlags::CCountryFlag> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    bVar2 = CCountryFlags::CCountryFlag::operator<
                      ((CCountryFlag *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                       ,in_stack_ffffffffffffff88);
    if (bVar2) {
      plain_range_sorted<CCountryFlags::CCountryFlag>::plain_range_sorted
                ((plain_range_sorted<CCountryFlags::CCountryFlag> *)0x15dbff);
    }
    else {
      while (uVar3 = plain_range<CCountryFlags::CCountryFlag>::size(&local_28), 1 < uVar3) {
        uVar3 = plain_range<CCountryFlags::CCountryFlag>::size(&local_28);
        plain_range<CCountryFlags::CCountryFlag>::index
                  (&local_28,(char *)(ulong)(uVar3 - 1 >> 1),__c);
        bVar2 = CCountryFlags::CCountryFlag::operator<
                          ((CCountryFlag *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff88);
        if (bVar2) {
          plain_range<CCountryFlags::CCountryFlag>::size(&local_28);
          pVar4 = plain_range_sorted<CCountryFlags::CCountryFlag>::slice
                            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                             in_stack_ffffffffffffff90);
          local_38 = pVar4.super_plain_range<CCountryFlags::CCountryFlag>.begin;
          local_28.begin = local_38;
          local_30 = pVar4.super_plain_range<CCountryFlags::CCountryFlag>.end;
          local_28.end = local_30;
        }
        else {
          pVar4 = plain_range_sorted<CCountryFlags::CCountryFlag>::slice
                            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                             in_stack_ffffffffffffff90);
          local_48 = pVar4.super_plain_range<CCountryFlags::CCountryFlag>.begin;
          local_28.begin = local_48;
          local_40 = pVar4.super_plain_range<CCountryFlags::CCountryFlag>.end;
          local_28.end = local_40;
        }
      }
      local_18 = local_28.begin;
      local_10 = local_28.end;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  pVar1.end = local_10;
  pVar1.begin = local_18;
  return (plain_range_sorted<CCountryFlags::CCountryFlag>)pVar1;
}

Assistant:

R partition_binary(R range, T value)
{
	concept_empty::check(range);
	concept_index::check(range);
	concept_size::check(range);
	concept_slice::check(range);
	concept_sorted::check(range);

	if(range.empty())
		return range;
	if(range.back() < value)
		return R();

	while(range.size() > 1)
	{
		unsigned pivot = (range.size()-1)/2;
		if(range.index(pivot) < value)
			range = range.slice(pivot+1, range.size()-1);
		else
			range = range.slice(0, pivot+1);
	}
	return range;
}